

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O2

int stmm_lookup(stmm_table *table,char *key,char **value)

{
  stmm_hash_func_type p_Var1;
  stmm_table_entry *psVar2;
  stmm_compare_func_type p_Var3;
  int iVar4;
  int iVar5;
  stmm_table_entry **ppsVar6;
  
  p_Var1 = table->hash;
  if (p_Var1 == stmm_ptrhash) {
    iVar4 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var1 == stmm_numhash) {
    iVar5 = (int)key;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 % table->num_bins;
  }
  else {
    iVar4 = (*p_Var1)(key,table->num_bins);
  }
  ppsVar6 = table->bins + iVar4;
  do {
    psVar2 = *ppsVar6;
    if (psVar2 == (stmm_table_entry *)0x0) {
      return 0;
    }
    p_Var3 = table->compare;
    if (p_Var3 == stmm_numcmp || p_Var3 == stmm_ptrcmp) {
      if (psVar2->key == key) {
LAB_00380dac:
        if (table->reorder_flag != 0) {
          *ppsVar6 = psVar2->next;
          ppsVar6 = table->bins;
          psVar2->next = ppsVar6[iVar4];
          ppsVar6[iVar4] = psVar2;
        }
        if (value == (char **)0x0) {
          return 1;
        }
        *value = psVar2->record;
        return 1;
      }
    }
    else {
      iVar5 = (*p_Var3)(key,psVar2->key);
      if (iVar5 == 0) goto LAB_00380dac;
    }
    ppsVar6 = &psVar2->next;
  } while( true );
}

Assistant:

int
stmm_lookup (stmm_table *table, char *key, char **value)
{
    int hash_val;
    stmm_table_entry *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    return 0;
    }
    else {
    if (value != NULL)
    {
        *value = ptr->record;
    }
    return 1;
    }
}